

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O2

void __thiscall
amrex::PODVector<long,_std::allocator<long>_>::AllocateBuffer
          (PODVector<long,_std::allocator<long>_> *this,size_type a_capacity)

{
  long *__dest;
  pointer plVar1;
  
  __dest = __gnu_cxx::new_allocator<long>::allocate
                     ((new_allocator<long> *)this,a_capacity,(void *)0x0);
  if (this->m_data == (pointer)0x0) {
    plVar1 = (pointer)0x0;
  }
  else {
    memcpy(__dest,this->m_data,this->m_size << 3);
    Gpu::Device::streamSynchronize();
    plVar1 = this->m_data;
  }
  operator_delete(plVar1,this->m_capacity << 3);
  this->m_data = __dest;
  this->m_capacity = a_capacity;
  return;
}

Assistant:

void AllocateBuffer (size_type a_capacity) noexcept
        {
            pointer new_data = allocate(a_capacity);
            if (m_data) {
                detail::memCopyImpl<Allocator>(new_data, m_data, size() * sizeof(T), *this);
                amrex::Gpu::streamSynchronize();
            }
            deallocate(m_data, capacity());
            m_data = new_data;
            m_capacity = a_capacity;
        }